

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

Normalizer2 * icu_63::Normalizer2Factory::getNoopInstance(UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode UVar2;
  size_t in_RSI;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (Normalizer2 *)0x0;
  }
  if ((noopInitOnce != 2) &&
     (UVar1 = umtx_initImplPreInit((UInitOnce *)&noopInitOnce), UVar1 != '\0')) {
    UVar2 = *errorCode;
    if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
      noopSingleton = (Normalizer2 *)UMemory::operator_new((UMemory *)0x8,in_RSI);
      if (noopSingleton == (Normalizer2 *)0x0) {
        noopSingleton = (Normalizer2 *)0x0;
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        UVar2 = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        (noopSingleton->super_UObject)._vptr_UObject = (_func_int **)&PTR__NoopNormalizer2_003eaee0;
        ucln_common_registerCleanup_63(UCLN_COMMON_NORMALIZER2,uprv_normalizer2_cleanup);
        UVar2 = *errorCode;
      }
    }
    DAT_003fc174 = UVar2;
    umtx_initImplPostInit((UInitOnce *)&noopInitOnce);
    return noopSingleton;
  }
  if (U_ZERO_ERROR < DAT_003fc174) {
    *errorCode = DAT_003fc174;
  }
  return noopSingleton;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }